

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_node.cc
# Opt level: O3

RC __thiscall QL_Node::PrintCondition(QL_Node *this,Condition condition)

{
  size_t sVar1;
  void *__dest;
  long lVar2;
  int num;
  char *pcVar3;
  size_t __size;
  
  if (condition.lhsAttr.relName == (char *)0x0) {
    condition.lhsAttr.relName = "NULL";
    sVar1 = 4;
  }
  else {
    sVar1 = strlen(condition.lhsAttr.relName);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,condition.lhsAttr.relName,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
  if (condition.lhsAttr.attrName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12b1d0);
  }
  else {
    sVar1 = strlen(condition.lhsAttr.attrName);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,condition.lhsAttr.attrName,sVar1);
  }
  switch(condition.op) {
  case EQ_OP:
    pcVar3 = "=";
    break;
  case NE_OP:
    pcVar3 = "!=";
    goto LAB_0011238f;
  case LT_OP:
    pcVar3 = "<";
    break;
  case GT_OP:
    pcVar3 = ">";
    break;
  case LE_OP:
    pcVar3 = "<=";
    goto LAB_0011238f;
  case GE_OP:
    pcVar3 = ">=";
LAB_0011238f:
    lVar2 = 2;
    goto LAB_00112394;
  default:
    return 0x195;
  }
  lVar2 = 1;
LAB_00112394:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  if (condition.bRhsIsAttr == 0) {
    if (condition.rhsValue.type != FLOAT) {
      if (condition.rhsValue.type == INT) {
        printf("%d ",(ulong)*condition.rhsValue.data);
        return 0;
      }
      sVar1 = strlen((char *)condition.rhsValue.data);
      __size = (size_t)((int)sVar1 + 1);
      __dest = malloc(__size);
      memcpy(__dest,condition.rhsValue.data,__size);
      *(undefined1 *)((long)__dest + (long)(int)sVar1) = 0;
      printf("%s ",__dest);
      free(__dest);
      return 0;
    }
    printf("%f ",(double)*condition.rhsValue.data);
  }
  else {
    if (condition.rhsAttr.relName == (char *)0x0) {
      condition.rhsAttr.relName = "NULL";
      sVar1 = 4;
    }
    else {
      sVar1 = strlen(condition.rhsAttr.relName);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,condition.rhsAttr.relName,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
    if (condition.rhsAttr.attrName == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12b1d0);
    }
    else {
      sVar1 = strlen(condition.rhsAttr.attrName);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,condition.rhsAttr.attrName,sVar1);
    }
  }
  return 0;
}

Assistant:

RC QL_Node::PrintCondition(const Condition condition){
  RC rc = 0;

  // Print the LHS attribute
  if(condition.lhsAttr.relName == NULL){
    cout << "NULL";
  }
  else
    cout << condition.lhsAttr.relName;
  cout << "." << condition.lhsAttr.attrName;

  // Print the operator
  switch(condition.op){
    case EQ_OP : cout << "="; break;
    case LT_OP : cout << "<"; break;
    case GT_OP : cout << ">"; break;
    case LE_OP : cout << "<="; break;
    case GE_OP : cout << ">="; break;
    case NE_OP : cout << "!="; break;
    default: return (QL_BADCOND);
  }
  // If the RHS is an attribute, print it
  if(condition.bRhsIsAttr){
    if(condition.rhsAttr.relName == NULL){
      cout << "NULL";
    }
    else
      cout << condition.rhsAttr.relName;
    cout << "." << condition.rhsAttr.attrName;
  }
  else{ // selects the correct printer format for this attribute
    if(condition.rhsValue.type == INT){
      print_int(condition.rhsValue.data, 4);
    }
    else if(condition.rhsValue.type == FLOAT){
      print_float(condition.rhsValue.data, 4);
    }
    else{
      print_string(condition.rhsValue.data, strlen((const char *)condition.rhsValue.data));
    }
  }

  return (0);
}